

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::objectivec::EnumValueShortName_abi_cxx11_
          (string *__return_storage_ptr__,objectivec *this,EnumValueDescriptor *descriptor)

{
  undefined1 *__s2;
  _Alloc_hider __s1;
  size_type sVar1;
  int iVar2;
  EnumValueDescriptor *descriptor_00;
  string long_name_prefix;
  string long_name;
  string class_name;
  undefined1 *local_90;
  size_t local_88;
  undefined1 local_80 [16];
  string local_70;
  string local_50;
  
  EnumName_abi_cxx11_(&local_50,*(objectivec **)(this + 0x10),(EnumDescriptor *)descriptor);
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,local_50._M_dataplus._M_p,
             local_50._M_dataplus._M_p + local_50._M_string_length);
  std::__cxx11::string::append((char *)&local_90);
  EnumValueName_abi_cxx11_(&local_70,this,descriptor_00);
  sVar1 = local_70._M_string_length;
  __s1._M_p = local_70._M_dataplus._M_p;
  if ((long)local_70._M_string_length < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig
              (local_70._M_string_length,"string length exceeds max size");
  }
  __s2 = local_90;
  if ((long)local_88 < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig(local_88,"string length exceeds max size")
    ;
  }
  if (local_88 <= sVar1) {
    iVar2 = bcmp(__s1._M_p,__s2,local_88);
    if (iVar2 == 0) {
      std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&local_70);
      goto LAB_0026fcd2;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_70._M_dataplus._M_p,
             local_70._M_dataplus._M_p + local_70._M_string_length);
LAB_0026fcd2:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string EnumValueShortName(const EnumValueDescriptor* descriptor) {
  // Enum value names (EnumValueName above) are the enum name turned into
  // a class name and then the value name is CamelCased and concatenated; the
  // whole thing then gets sanitized for reserved words.
  // The "short name" is intended to be the final leaf, the value name; but
  // you can't simply send that off to sanitize as that could result in it
  // getting modified when the full name didn't.  For example enum
  // "StorageModes" has a value "retain".  So the full name is
  // "StorageModes_Retain", but if we sanitize "retain" it would become
  // "RetainValue".
  // So the right way to get the short name is to take the full enum name
  // and then strip off the enum name (leaving the value name and anything
  // done by sanitize).
  const std::string class_name = EnumName(descriptor->type());
  const std::string long_name_prefix = class_name + "_";
  const std::string long_name = EnumValueName(descriptor);
  return StripPrefixString(long_name, long_name_prefix);
}